

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-pipe.c
# Opt level: O0

void lws_plat_pipe_close(lws *wsi)

{
  lws_context *plVar1;
  int iVar2;
  lws_context_per_thread *pt;
  lws *wsi_local;
  
  plVar1 = (wsi->a).context;
  iVar2 = (int)wsi->tsi;
  if ((plVar1->pt[iVar2].dummy_pipe_fds[0] != 0) && (plVar1->pt[iVar2].dummy_pipe_fds[0] != -1)) {
    close(plVar1->pt[iVar2].dummy_pipe_fds[0]);
  }
  if ((plVar1->pt[iVar2].dummy_pipe_fds[1] != 0) && (plVar1->pt[iVar2].dummy_pipe_fds[1] != -1)) {
    close(plVar1->pt[iVar2].dummy_pipe_fds[1]);
  }
  plVar1->pt[iVar2].dummy_pipe_fds[1] = -1;
  plVar1->pt[iVar2].dummy_pipe_fds[0] = -1;
  return;
}

Assistant:

void
lws_plat_pipe_close(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];

	if (pt->dummy_pipe_fds[0] && pt->dummy_pipe_fds[0] != -1)
		close(pt->dummy_pipe_fds[0]);
	if (pt->dummy_pipe_fds[1] && pt->dummy_pipe_fds[1] != -1)
		close(pt->dummy_pipe_fds[1]);

	pt->dummy_pipe_fds[0] = pt->dummy_pipe_fds[1] = -1;
}